

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

uint64 __thiscall google::protobuf::internal::ArenaImpl::SerialArena::SpaceUsed(SerialArena *this)

{
  Block *pBVar1;
  long lVar2;
  
  lVar2 = (long)this->ptr_ - (long)this->head_;
  for (pBVar1 = this->head_->next_; pBVar1 != (Block *)0x0; pBVar1 = pBVar1->next_) {
    lVar2 = lVar2 + -0x18 + pBVar1->pos_;
  }
  return lVar2 - 0x60;
}

Assistant:

uint64 ArenaImpl::SerialArena::SpaceUsed() const {
  // Get current block's size from ptr_ (since we can't trust head_->pos().
  uint64 space_used = ptr_ - head_->Pointer(kBlockHeaderSize);
  // Get subsequent block size from b->pos().
  for (Block* b = head_->next(); b; b = b->next()) {
    space_used += (b->pos() - kBlockHeaderSize);
  }
  // Remove the overhead of the SerialArena itself.
  space_used -= kSerialArenaSize;
  return space_used;
}